

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_allocator.h
# Opt level: O0

void __thiscall
density::detail::PageAllocator<density::detail::SystemPageManager<65536UL>_>::discard_page_stack
          (PageAllocator<density::detail::SystemPageManager<65536UL>_> *this,
          page_allocation_type i_allocation_type,PageStack *i_page_stack)

{
  PageAllocatorSlot *pPVar1;
  bool bVar2;
  bool bVar3;
  WF_PageStack *this_00;
  __pointer_type pPVar4;
  PageStack *this_01;
  bool done;
  PageAllocatorSlot *original_slot;
  PageStack *i_page_stack_local;
  page_allocation_type i_allocation_type_local;
  PageAllocator<density::detail::SystemPageManager<65536UL>_> *this_local;
  
  bVar2 = PageStack::empty(i_page_stack);
  if (bVar2) {
    density_tests::detail::assert_failed<>
              ("!i_page_stack.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/page_allocator.h"
               ,0x19d);
  }
  pPVar1 = this->m_current_slot;
  bVar2 = false;
  do {
    this_00 = PageAllocatorSlot::get_stack(this->m_current_slot,i_allocation_type);
    bVar3 = WF_PageStack::try_push(this_00,i_page_stack);
    if (bVar3) {
      bVar2 = true;
      break;
    }
    pPVar4 = std::atomic<density::detail::PageAllocatorSlot_*>::load
                       (&this->m_current_slot->m_next_slot,memory_order_seq_cst);
    this->m_current_slot = pPVar4;
  } while (this->m_current_slot != pPVar1);
  if (!bVar2) {
    this_01 = get_private_stack(this,i_allocation_type);
    PageStack::push(this_01,i_page_stack);
  }
  return;
}

Assistant:

void discard_page_stack(
              page_allocation_type const i_allocation_type, PageStack & i_page_stack) noexcept
            {
                DENSITY_ASSERT_INTERNAL(!i_page_stack.empty());

                // try to push the page once on every slot
                auto * const original_slot = m_current_slot;
                bool         done          = false;
                do
                {

                    if (m_current_slot->get_stack(i_allocation_type).try_push(i_page_stack))
                    {
                        done = true;
                        break;
                    }

                    m_current_slot = m_current_slot->m_next_slot.load();
                } while (m_current_slot != original_slot);

                // this is unlikely, but it may happen
                if (!done)
                {
                    get_private_stack(i_allocation_type).push(i_page_stack);
                }
            }